

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O0

int Io_ReadDsdStrSplit(char *pCur,char **pParts,int *pTypeXor)

{
  bool bVar1;
  char **ppcVar2;
  int local_38;
  uint local_34;
  int nParts;
  int fPri;
  int fXor;
  int fAnd;
  int *pTypeXor_local;
  char **pParts_local;
  char *pCur_local;
  
  fPri = 0;
  nParts = 0;
  local_34 = 0;
  local_38 = 0;
  pParts_local = (char **)pCur;
  if (*pCur == '\0') {
    __assert_fail("*pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadDsd.c"
                  ,0x4c,"int Io_ReadDsdStrSplit(char *, char **, int *)");
  }
  while( true ) {
    pCur_local._4_4_ = local_38 + 1;
    pParts[local_38] = (char *)pParts_local;
    if (*(char *)pParts_local == '!') {
      pParts_local = (char **)((long)pParts_local + 1);
    }
    if ((*(char *)pParts_local < 'a') || (ppcVar2 = pParts_local, 'z' < *(char *)pParts_local)) {
      while( true ) {
        if (((*(char *)pParts_local < '0') || (bVar1 = true, '9' < *(char *)pParts_local)) &&
           (bVar1 = false, '@' < *(char *)pParts_local)) {
          bVar1 = *(char *)pParts_local < 'G';
        }
        if (!bVar1) break;
        pParts_local = (char **)((long)pParts_local + 1);
      }
      if (*(char *)pParts_local != '(') {
        printf("Cannot find the opening parenthesis.\n");
        goto LAB_003affaa;
      }
      ppcVar2 = (char **)Io_ReadDsdFindEnd((char *)pParts_local);
      if (ppcVar2 == (char **)0x0) {
        printf("Cannot find the closing parenthesis.\n");
        goto LAB_003affaa;
      }
    }
    pParts_local = (char **)((long)ppcVar2 + 1);
    if (*(char *)pParts_local == '\0') goto LAB_003affaa;
    if (((*(char *)pParts_local != '*') && (*(char *)pParts_local != '+')) &&
       (*(char *)pParts_local != ',')) break;
    fPri = (uint)(*(char *)pParts_local == '*') | fPri;
    nParts = (uint)(*(char *)pParts_local == '+') | nParts;
    local_34 = *(char *)pParts_local == ',' | local_34;
    *(undefined1 *)pParts_local = 0;
    local_38 = pCur_local._4_4_;
    pParts_local = (char **)((long)ppcVar2 + 2);
  }
  printf("Wrong separating symbol.\n");
LAB_003affaa:
  if (fPri + nParts + local_34 < 2) {
    *pTypeXor = nParts;
  }
  else {
    printf("Different types of separating symbol ennPartsed.\n");
    pCur_local._4_4_ = 0;
  }
  return pCur_local._4_4_;
}

Assistant:

int Io_ReadDsdStrSplit( char * pCur, char * pParts[], int * pTypeXor )
{
    int fAnd = 0, fXor = 0, fPri = 0, nParts = 0;
    assert( *pCur );
    // process the parts
    while ( 1 )
    {
        // save the current part
        pParts[nParts++] = pCur;
        // skip the complement
        if ( *pCur == '!' )
            pCur++;
        // skip var
        if ( *pCur >= 'a' && *pCur <= 'z' )
            pCur++;
        else
        {
            // skip hex truth table
            while ( (*pCur >= '0' && *pCur <= '9') || (*pCur >= 'A' && *pCur <= 'F') )
                pCur++;
            // process parentheses
            if ( *pCur != '(' )
            {
                printf( "Cannot find the opening parenthesis.\n" );
                break;
            }
            // find the corresponding closing parenthesis
            pCur = Io_ReadDsdFindEnd( pCur );
            if ( pCur == NULL )
            {
                printf( "Cannot find the closing parenthesis.\n" );
                break;
            }
            pCur++;
        }
        // check the end
        if ( *pCur == 0 )
            break;
        // check symbol
        if ( *pCur != '*' && *pCur != '+' && *pCur != ',' )
        {
            printf( "Wrong separating symbol.\n" );
            break;
        }
        // remember the symbol
        fAnd |= (*pCur == '*');
        fXor |= (*pCur == '+');
        fPri |= (*pCur == ',');
        *pCur++ = 0;
    }
    // check separating symbols
    if ( fAnd + fXor + fPri > 1 )
    {
        printf( "Different types of separating symbol ennPartsed.\n" );
        return 0;
    }
    *pTypeXor = fXor;
    return nParts;
}